

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::ReadCollectionFont
               (Buffer *file,uint8_t *data,size_t len,Font *font,
               map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
               *all_tables)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr *__k;
  uint uVar4;
  _Rb_tree_color _Var5;
  bool bVar6;
  _Base_ptr p_Var7;
  mapped_type *ppTVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  mapped_type pTVar12;
  
  uVar1 = file->offset_ + 4;
  if (uVar1 <= file->length_) {
    uVar4 = *(uint *)(file->buffer_ + file->offset_);
    font->flavor = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    file->offset_ = uVar1;
    bVar6 = ReadTrueTypeFont(file,data,len,font);
    if (bVar6) {
      p_Var9 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 == p_Var2) {
        return true;
      }
      p_Var3 = &(all_tables->_M_t)._M_impl.super__Rb_tree_header;
      do {
        __k = &p_Var9[1]._M_left;
        p_Var10 = (all_tables->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var3->_M_header;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            bVar6 = (uint)*(size_t *)(p_Var10 + 1) < *(uint *)__k;
            if (!bVar6) {
              p_Var7 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[bVar6];
          } while (p_Var10 != (_Base_ptr)0x0);
        }
        p_Var11 = p_Var3;
        if (((_Rb_tree_header *)p_Var7 != p_Var3) &&
           (p_Var11 = (_Rb_tree_header *)p_Var7,
           *(uint *)__k < (uint)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var11 = p_Var3;
        }
        if (p_Var11 == p_Var3) {
          _Var5 = *(_Rb_tree_color *)&p_Var9[1]._M_parent;
          p_Var10 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 = &p_Var2->_M_header;
          for (; (_Rb_tree_header *)p_Var10 != (_Rb_tree_header *)0x0;
              p_Var10 = (&p_Var10->_M_left)[bVar6]) {
            bVar6 = (_Rb_tree_color)*(size_t *)(p_Var10 + 1) < _Var5;
            if (!bVar6) {
              p_Var7 = p_Var10;
            }
          }
          p_Var10 = &p_Var2->_M_header;
          if (((_Rb_tree_header *)p_Var7 != p_Var2) &&
             (p_Var10 = p_Var7, _Var5 < p_Var7[1]._M_color)) {
            p_Var10 = &p_Var2->_M_header;
          }
          pTVar12 = (mapped_type)&p_Var10[1]._M_parent;
          if ((_Rb_tree_header *)p_Var10 == p_Var2) {
            pTVar12 = (mapped_type)0x0;
          }
          ppTVar8 = std::
                    map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                    ::operator[](all_tables,(key_type *)__k);
          *ppTVar8 = pTVar12;
        }
        else {
          ppTVar8 = std::
                    map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                    ::operator[](all_tables,(key_type *)__k);
          p_Var9[2]._M_right = (_Base_ptr)*ppTVar8;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadCollectionFont(Buffer* file, const uint8_t* data, size_t len,
                        Font* font,
                        std::map<uint32_t, Font::Table*>* all_tables) {
  if (!file->ReadU32(&font->flavor)) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (!ReadTrueTypeFont(file, data, len, font)) {
    return FONT_COMPRESSION_FAILURE();
  }

  for (auto& entry : font->tables) {
    Font::Table& table = entry.second;

    if (all_tables->find(table.offset) == all_tables->end()) {
      (*all_tables)[table.offset] = font->FindTable(table.tag);
    } else {
      table.reuse_of = (*all_tables)[table.offset];
    }

  }
  return true;
}